

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_portals.cxx
# Opt level: O0

void __thiscall
xray_re::xr_level_portals::load(xr_level_portals *this,uint32_t xrlc_version,xr_reader *r)

{
  xr_reader *local_28;
  xr_reader *s;
  xr_reader *r_local;
  xr_level_portals *pxStack_10;
  uint32_t xrlc_version_local;
  xr_level_portals *this_local;
  
  local_28 = (xr_reader *)0x0;
  s = r;
  r_local._4_4_ = xrlc_version;
  pxStack_10 = this;
  if (xrlc_version == 5) {
    local_28 = xr_reader::open_chunk(r,7);
    if (local_28 != (xr_reader *)0x0) {
      load_v5(this,local_28);
    }
  }
  else {
    if (xrlc_version < 10) {
      local_28 = xr_reader::open_chunk(r,6);
    }
    else if (0xb < xrlc_version) {
      local_28 = xr_reader::open_chunk(r,4);
    }
    if (local_28 != (xr_reader *)0x0) {
      load_v8(this,local_28);
    }
  }
  xr_reader::close_chunk(s,&local_28);
  return;
}

Assistant:

void xr_level_portals::load(uint32_t xrlc_version, xr_reader& r)
{
	xr_reader* s = 0;
	if (xrlc_version == XRLC_VERSION_5) {
		s = r.open_chunk(FSL5_PORTALS);
		if (s)
			load_v5(*s);
	} else {
		if (xrlc_version <= XRLC_VERSION_9)
			s = r.open_chunk(FSL8_PORTALS);
		else if (xrlc_version >= XRLC_VERSION_12)
			s = r.open_chunk(FSL13_PORTALS);
		if (s)
			load_v8(*s);
	}
	r.close_chunk(s);
}